

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioport.c
# Opt level: O0

uint8_t cpu_inb_x86_64(uc_struct_conflict *uc,uint32_t addr)

{
  uint8_t uVar1;
  bool bVar2;
  list_item *local_30;
  list_item *cur;
  hook *hook;
  uint32_t addr_local;
  uc_struct_conflict *uc_local;
  
  local_30 = uc->hook[1].head;
  while( true ) {
    bVar2 = false;
    if (local_30 != (list_item *)0x0) {
      cur = (list_item *)local_30->data;
      bVar2 = cur != (list_item *)0x0;
    }
    if (!bVar2) break;
    if ((((ulong)cur[1].next & 0x100000000) == 0) && (*(int *)((long)&cur->next + 4) == 0xda)) {
      uVar1 = (*(code *)cur[2].data)(uc,addr,1,cur[3].next);
      return uVar1;
    }
    local_30 = local_30->next;
  }
  return '\0';
}

Assistant:

uint8_t cpu_inb(struct uc_struct *uc, uint32_t addr)
{
    // uint8_t val;

    // address_space_read(&uc->address_space_io, addr, MEMTXATTRS_UNSPECIFIED,
    //                    &val, 1);

    //LOG_IOPORT("inb : %04"FMT_pioaddr" %02"PRIx8"\n", addr, val);
    // Unicorn: call registered IN callbacks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (hook->insn == UC_X86_INS_IN)
            return ((uc_cb_insn_in_t)hook->callback)(uc, addr, 1, hook->user_data);
    }

    return 0;
}